

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

bool __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,std::allocator<phmap::priv::(anonymous_namespace)::Entry>>
::
if_contains<phmap::priv::(anonymous_namespace)::Entry,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_IfContains_Test::TestBody()::__0&>
          (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,std::allocator<phmap::priv::(anonymous_namespace)::Entry>>
           *this,key_arg<phmap::priv::(anonymous_namespace)::Entry> *key,anon_class_8_1_ba1d8281 *f)

{
  bool bVar1;
  anon_class_8_1_ba1d8281 *f_local;
  key_arg<phmap::priv::(anonymous_namespace)::Entry> *key_local;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  *this_local;
  
  bVar1 = modify_if_impl<phmap::priv::(anonymous_namespace)::Entry,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_IfContains_Test::TestBody()::__0&,phmap::LockableBaseImpl<phmap::NullMutex>::DoNothing>
                    (this,key,f);
  return bVar1;
}

Assistant:

bool if_contains(const key_arg<K>& key, F&& f) const {
        return const_cast<parallel_hash_set*>(this)->template 
            modify_if_impl<K, F, SharedLock>(key, std::forward<F>(f));
    }